

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cc
# Opt level: O2

void flow::lang::completeDefaultValue
               (ParamList *args,LiteralType type,DefaultValue *dv,string *name)

{
  int iVar1;
  variant_alternative_t<5UL,_variant<monostate,_bool,_basic_string<char>,_long,_IPAddress,_Cidr,_RegExp>_>
  *__args_1;
  SourceLocation *pSVar2;
  variant_alternative_t<4UL,_variant<monostate,_bool,_basic_string<char>,_long,_IPAddress,_Cidr,_RegExp>_>
  *__args_1_00;
  __uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> local_30;
  _Head_base<0UL,_flow::lang::Expr_*,_false> local_28;
  
  if ((completeDefaultValue(flow::lang::ParamList&,flow::LiteralType,std::variant<std::monostate,bool,std::__cxx11::string,long,flow::util::IPAddress,flow::util::Cidr,flow::util::RegExp>const&,std::__cxx11::string_const&)
       ::loc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&completeDefaultValue(flow::lang::ParamList&,flow::LiteralType,std::variant<std::monostate,bool,std::__cxx11::string,long,flow::util::IPAddress,flow::util::Cidr,flow::util::RegExp>const&,std::__cxx11::string_const&)
                                   ::loc), iVar1 != 0)) {
    SourceLocation::SourceLocation(&completeDefaultValue::loc);
    __cxa_atexit(SourceLocation::~SourceLocation,&completeDefaultValue::loc,&__dso_handle);
    __cxa_guard_release(&completeDefaultValue(flow::lang::ParamList&,flow::LiteralType,std::variant<std::monostate,bool,std::__cxx11::string,long,flow::util::IPAddress,flow::util::Cidr,flow::util::RegExp>const&,std::__cxx11::string_const&)
                         ::loc);
  }
  switch(type) {
  case Boolean:
    pSVar2 = (SourceLocation *)
             std::
             get<1ul,std::monostate,bool,std::__cxx11::string,long,flow::util::IPAddress,flow::util::Cidr,flow::util::RegExp>
                       (dv);
    std::make_unique<flow::lang::LiteralExpr<bool>,bool_const&,flow::SourceLocation_const&>
              ((bool *)&stack0xffffffffffffffd8,pSVar2);
    local_30._M_t.super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>
    .super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl =
         (tuple<flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>)
         (tuple<flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>)local_28._M_head_impl;
    local_28._M_head_impl = (Expr *)0x0;
    ParamList::push_back
              (args,name,
               (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)&local_30);
    break;
  case Number:
    pSVar2 = (SourceLocation *)
             std::
             get<3ul,std::monostate,bool,std::__cxx11::string,long,flow::util::IPAddress,flow::util::Cidr,flow::util::RegExp>
                       (dv);
    std::make_unique<flow::lang::LiteralExpr<long_long>,long_const&,flow::SourceLocation_const&>
              ((long *)&stack0xffffffffffffffd8,pSVar2);
    local_30._M_t.super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>
    .super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl =
         (tuple<flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>)
         (tuple<flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>)local_28._M_head_impl;
    local_28._M_head_impl = (Expr *)0x0;
    ParamList::push_back
              (args,name,
               (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)&local_30);
    break;
  case String:
    pSVar2 = (SourceLocation *)
             std::
             get<2ul,std::monostate,bool,std::__cxx11::string,long,flow::util::IPAddress,flow::util::Cidr,flow::util::RegExp>
                       (dv);
    std::
    make_unique<flow::lang::LiteralExpr<std::__cxx11::string>,std::__cxx11::string_const&,flow::SourceLocation_const&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffffd8,pSVar2);
    local_30._M_t.super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>
    .super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl =
         (tuple<flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>)
         (tuple<flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>)local_28._M_head_impl;
    local_28._M_head_impl = (Expr *)0x0;
    ParamList::push_back
              (args,name,
               (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)&local_30);
    break;
  default:
    fwrite("Unsupported type in default completion. Please report me. I am a bug.",0x45,1,_stderr);
    abort();
  case IPAddress:
    __args_1_00 = std::
                  get<4ul,std::monostate,bool,std::__cxx11::string,long,flow::util::IPAddress,flow::util::Cidr,flow::util::RegExp>
                            (dv);
    std::
    make_unique<flow::lang::LiteralExpr<flow::util::IPAddress>,flow::util::IPAddress_const&,flow::SourceLocation_const&>
              ((IPAddress *)&stack0xffffffffffffffd8,(SourceLocation *)__args_1_00);
    local_30._M_t.super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>
    .super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl =
         (tuple<flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>)
         (tuple<flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>)local_28._M_head_impl;
    local_28._M_head_impl = (Expr *)0x0;
    ParamList::push_back
              (args,name,
               (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)&local_30);
    break;
  case Cidr:
    __args_1 = std::
               get<5ul,std::monostate,bool,std::__cxx11::string,long,flow::util::IPAddress,flow::util::Cidr,flow::util::RegExp>
                         (dv);
    std::
    make_unique<flow::lang::LiteralExpr<flow::util::Cidr>,flow::util::Cidr_const&,flow::SourceLocation_const&>
              ((Cidr *)&stack0xffffffffffffffd8,(SourceLocation *)__args_1);
    local_30._M_t.super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>
    .super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl =
         (tuple<flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>)
         (tuple<flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>)local_28._M_head_impl;
    local_28._M_head_impl = (Expr *)0x0;
    ParamList::push_back
              (args,name,
               (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)&local_30);
  }
  if (local_30._M_t.
      super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>.
      super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>)0x0) {
    (**(code **)(*(long *)local_30._M_t.
                          super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>
                          .super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl + 8))();
  }
  local_30._M_t.super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>.
  super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl =
       (tuple<flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>)
       (_Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>)0x0;
  if (local_28._M_head_impl != (Expr *)0x0) {
    (**(code **)(*(long *)local_28._M_head_impl + 8))();
  }
  return;
}

Assistant:

static inline void completeDefaultValue(
    ParamList& args,
    LiteralType type,
    const NativeCallback::DefaultValue& dv,
    const std::string& name) { // {{{
  // printf("completeDefaultValue(type:%s, name:%s)\n", tos(type).c_str(),
  // name.c_str());

  static const SourceLocation loc;

  switch (type) {
    case LiteralType::Boolean:
      args.push_back(
          name,
          std::make_unique<BoolExpr>(std::get<bool>(dv), loc));
      break;
    case LiteralType::Number:
      args.push_back(
          name,
          std::make_unique<NumberExpr>(std::get<FlowNumber>(dv), loc));
      break;
    case LiteralType::String:
      args.push_back(
          name,
          std::make_unique<StringExpr>(std::get<FlowString>(dv), loc));
      break;
    case LiteralType::IPAddress:
      args.push_back(
          name,
          std::make_unique<IPAddressExpr>(std::get<util::IPAddress>(dv), loc));
      break;
    case LiteralType::Cidr:
      args.push_back(
          name,
          std::make_unique<CidrExpr>(std::get<util::Cidr>(dv), loc));
      break;
    default:
      fprintf(stderr, "Unsupported type in default completion. Please report me. I am a bug.");
      abort();
      // reportError("Cannot complete named paramter \"%s\" in callee \"%s\".
      // Unsupported type <%s>.",
      //        name.c_str(), this->name().c_str(), tos(type).c_str());
      break;
  }
}